

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChArchiveOut::out<chrono::geometry::ChLinePath>
          (ChArchiveOut *this,ChNameValue<chrono::geometry::ChLinePath> *bVal)

{
  byte bVar1;
  byte flags;
  ChExceptionArchive *this_00;
  allocator local_a2;
  bool already_stored;
  size_t obj_ID;
  ChValueSpecific<chrono::geometry::ChLinePath> specVal;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  obj_ID = 0;
  bVar1 = bVal->_flags;
  flags = bVar1;
  if ((bVar1 & 1) != 0) {
    PutPointer(this,bVal->_value,&already_stored,&obj_ID);
    if (already_stored == true) {
      this_00 = (ChExceptionArchive *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_60,bVal->_name,&local_a2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&specVal,
                     "Cannot serialize tracked object \'",&local_60);
      std::operator+(&local_40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&specVal,
                     "\' by value, AFTER already serialized by pointer.");
      ChExceptionArchive::ChExceptionArchive(this_00,&local_40);
      __cxa_throw(this_00,&ChExceptionArchive::typeinfo,ChException::~ChException);
    }
    flags = bVal->_flags;
  }
  ChValueSpecific<chrono::geometry::ChLinePath>::ChValueSpecific
            (&specVal,bVal->_value,bVal->_name,flags);
  (*(this->super_ChArchive)._vptr_ChArchive[0xc])(this,&specVal,(ulong)(bVar1 & 1),obj_ID);
  ChValue::~ChValue(&specVal.super_ChValue);
  return;
}

Assistant:

void out (ChNameValue<T> bVal) {
          bool tracked = false;
          size_t obj_ID =0;
          if (bVal.flags() & NVP_TRACK_OBJECT)
          {
              bool already_stored; 
              T* mptr = &bVal.value();
              PutPointer(mptr, already_stored, obj_ID);
              if (already_stored) 
                  {throw (ChExceptionArchive( "Cannot serialize tracked object '" + std::string(bVal.name()) + "' by value, AFTER already serialized by pointer."));}
              tracked = true;
          }
          ChValueSpecific< T > specVal(bVal.value(), bVal.name(), bVal.flags());
          this->out(
              specVal,
              tracked, 
              obj_ID);
      }